

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLGrammarPoolImpl.cpp
# Opt level: O0

XSModel * __thiscall
xercesc_4_0::XMLGrammarPoolImpl::getXSModel(XMLGrammarPoolImpl *this,bool *XSModelWasChanged)

{
  bool *XSModelWasChanged_local;
  XMLGrammarPoolImpl *this_local;
  
  *XSModelWasChanged = false;
  if (((this->fLocked & 1U) == 0) && ((this->fXSModelIsValid & 1U) == 0)) {
    (*(this->super_XMLGrammarPool)._vptr_XMLGrammarPool[0x11])();
    *XSModelWasChanged = true;
    this_local = (XMLGrammarPoolImpl *)this->fXSModel;
  }
  else {
    this_local = (XMLGrammarPoolImpl *)this->fXSModel;
  }
  return (XSModel *)this_local;
}

Assistant:

XSModel *XMLGrammarPoolImpl::getXSModel(bool& XSModelWasChanged)
{
    XSModelWasChanged = false;
    if (fLocked || fXSModelIsValid)
        return fXSModel;

    createXSModel();
    XSModelWasChanged = true;
    return fXSModel;
}